

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::CompactData::CompactDataSink::put
          (CompactDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  CompactData *pCVar1;
  UBool UVar2;
  char cVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  char16_t *s1;
  int i4;
  int i;
  int32_t patternLength;
  ResourceTable powersOfTenTable;
  ResourceTable pluralVariantsTable;
  uint local_b0;
  uint local_ac;
  char *local_a8;
  int32_t local_a0;
  int local_9c;
  undefined8 local_98;
  long local_90;
  ulong local_88;
  ResourceTable local_80;
  ResourceTable local_58;
  
  local_a8 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_80,value,status,CONCAT71(in_register_00000009,param_3));
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = 0;
    while (UVar2 = ResourceTable::getKeyAndValue(&local_80,iVar4,&local_a8,value), UVar2 != '\0') {
      local_a0 = iVar4;
      sVar7 = strlen(local_a8);
      cVar3 = (char)sVar7 + -1;
      local_98 = CONCAT71((int7)(sVar7 >> 8),cVar3);
      local_90 = (long)cVar3;
      local_b0 = (uint)(byte)this->data->multipliers[local_90];
      (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      local_9c = (char)local_98 * 6;
      local_88 = (ulong)(uint)~(int)(char)local_98;
      i = 0;
      while( true ) {
        UVar2 = ResourceTable::getKeyAndValue(&local_58,i,&local_a8,value);
        if (UVar2 == '\0') break;
        iVar4 = StandardPlural::indexFromString(local_a8,status);
        if (U_ZERO_ERROR < *status) {
          return;
        }
        iVar5 = iVar4 + local_9c;
        if (this->data->patterns[iVar5] == (UChar *)0x0) {
          iVar6 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_ac,status);
          s1 = (char16_t *)CONCAT44(extraout_var,iVar6);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          iVar4 = u_strcmp_63(s1,L"0");
          if (iVar4 == 0) {
            local_ac = 0;
            s1 = L"<USE FALLBACK>";
          }
          this->data->patterns[iVar5] = s1;
          if ((char)local_b0 == '\0') {
            uVar9 = 0;
            uVar8 = (ulong)local_ac;
            if ((int)local_ac < 1) {
              uVar8 = uVar9;
            }
            iVar5 = 0;
            for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              if (s1[uVar9] == L'0') {
                iVar5 = iVar5 + 1;
              }
              else if (0 < iVar5) break;
            }
            local_b0 = iVar5 + (int)local_88;
            if (iVar5 < 1) {
              local_b0 = 0;
            }
          }
        }
        i = i + 1;
      }
      if (this->data->multipliers[local_90] == '\0') {
        this->data->multipliers[local_90] = (char)local_b0;
        pCVar1 = this->data;
        if (pCVar1->largestMagnitude < (char)local_98) {
          pCVar1->largestMagnitude = (char)local_98;
        }
        pCVar1->isEmpty = '\0';
      }
      iVar4 = local_a0 + 1;
    }
  }
  return;
}

Assistant:

void CompactData::CompactDataSink::put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                                       UErrorCode &status) {
    // traverse into the table of powers of ten
    ResourceTable powersOfTenTable = value.getTable(status);
    if (U_FAILURE(status)) { return; }
    for (int i3 = 0; powersOfTenTable.getKeyAndValue(i3, key, value); ++i3) {

        // Assumes that the keys are always of the form "10000" where the magnitude is the
        // length of the key minus one.  We expect magnitudes to be less than MAX_DIGITS.
        auto magnitude = static_cast<int8_t> (strlen(key) - 1);
        int8_t multiplier = data.multipliers[magnitude];
        U_ASSERT(magnitude < COMPACT_MAX_DIGITS);

        // Iterate over the plural variants ("one", "other", etc)
        ResourceTable pluralVariantsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i4 = 0; pluralVariantsTable.getKeyAndValue(i4, key, value); ++i4) {

            // Skip this magnitude/plural if we already have it from a child locale.
            // Note: This also skips USE_FALLBACK entries.
            StandardPlural::Form plural = StandardPlural::fromString(key, status);
            if (U_FAILURE(status)) { return; }
            if (data.patterns[getIndex(magnitude, plural)] != nullptr) {
                continue;
            }

            // The value "0" means that we need to use the default pattern and not fall back
            // to parent locales. Example locale where this is relevant: 'it'.
            int32_t patternLength;
            const UChar *patternString = value.getString(patternLength, status);
            if (U_FAILURE(status)) { return; }
            if (u_strcmp(patternString, u"0") == 0) {
                patternString = USE_FALLBACK;
                patternLength = 0;
            }

            // Save the pattern string. We will parse it lazily.
            data.patterns[getIndex(magnitude, plural)] = patternString;

            // If necessary, compute the multiplier: the difference between the magnitude
            // and the number of zeros in the pattern.
            if (multiplier == 0) {
                int32_t numZeros = countZeros(patternString, patternLength);
                if (numZeros > 0) { // numZeros==0 in certain cases, like Somali "Kun"
                    multiplier = static_cast<int8_t> (numZeros - magnitude - 1);
                }
            }
        }

        // Save the multiplier.
        if (data.multipliers[magnitude] == 0) {
            data.multipliers[magnitude] = multiplier;
            if (magnitude > data.largestMagnitude) {
                data.largestMagnitude = magnitude;
            }
            data.isEmpty = false;
        } else {
            U_ASSERT(data.multipliers[magnitude] == multiplier);
        }
    }
}